

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O2

void __thiscall FlatZinc::FlatZincSpace::printDomains(FlatZincSpace *this,ostream *out)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  char cVar1;
  BoolView *pBVar2;
  bool bVar3;
  mapped_type *pmVar4;
  long lVar5;
  ostream *poVar6;
  IntVar *pIVar7;
  mapped_type *pmVar8;
  long lVar9;
  bool bVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  reference rVar14;
  IntVar *var;
  uint local_78;
  bool local_74;
  FlatZincSpace *local_70;
  ulong local_68;
  BoolView otherval;
  string varName;
  
  std::operator<<(out,"{");
  bVar10 = true;
  local_68 = 0x1f5560;
  local_70 = this;
  for (uVar12 = 0; uVar12 < (local_70->iv).sz; uVar12 = uVar12 + 1) {
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->iv_introduced,uVar12);
    if ((*rVar14._M_p & rVar14._M_mask) == 0) {
      var = (local_70->iv).data[uVar12];
      pmVar4 = std::
               map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&intVarString_abi_cxx11_,&var);
      std::__cxx11::string::string((string *)&varName,(string *)pmVar4);
      if ((varName._M_string_length != 0) &&
         (lVar5 = std::__cxx11::string::find((string *)&varName,local_68), lVar5 != -1)) {
        if (!bVar10) {
          std::operator<<(out,",");
        }
        poVar6 = std::operator<<(out,'\"');
        poVar6 = std::operator<<(poVar6,(string *)&varName);
        poVar6 = std::operator<<(poVar6,'\"');
        std::operator<<(poVar6,":");
        std::operator<<(out,"[");
        if (var->vals == (Tchar *)0x0) {
          poVar6 = std::operator<<(out,'[');
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(var->min).v);
          poVar6 = std::operator<<(poVar6,",");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(var->max).v);
          std::operator<<(poVar6,']');
        }
        else {
          iVar13 = (var->min).v;
          bVar10 = true;
          pIVar7 = var;
          for (lVar5 = (long)iVar13; lVar5 <= (pIVar7->max).v; lVar5 = lVar5 + 1) {
            if (pIVar7->vals[lVar5].v != '\0') {
              if (!bVar10) {
                std::operator<<(out,",");
              }
              std::ostream::operator<<((ostream *)out,iVar13);
              bVar10 = false;
              pIVar7 = var;
            }
            iVar13 = iVar13 + 1;
          }
        }
        std::operator<<(out,"]");
        bVar10 = false;
      }
      std::__cxx11::string::~string((string *)&varName);
    }
  }
  this_00 = &local_70->bv_introduced;
  lVar5 = 8;
  uVar12 = 0;
  do {
    if ((local_70->bv).sz <= uVar12) {
      std::operator<<(out,"}");
      return;
    }
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar12);
    if ((*rVar14._M_p & rVar14._M_mask) == 0) {
      pBVar2 = (local_70->bv).data;
      var = (IntVar *)&PTR_finished_001efbb8;
      local_74 = *(bool *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar5 + 4);
      local_78 = *(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar5);
      pmVar8 = std::
               map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&boolVarString_abi_cxx11_,(key_type *)&var);
      std::__cxx11::string::string((string *)&varName,(string *)pmVar8);
      lVar9 = std::__cxx11::string::find((string *)&varName,local_68);
      if (lVar9 != -1) {
        if (varName._M_string_length == 0) {
          otherval.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
          otherval.v = local_78;
          otherval.s = (bool)(local_74 ^ 1);
          std::
          map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&boolVarString_abi_cxx11_,&otherval);
          std::__cxx11::string::_M_assign((string *)&varName);
        }
        bVar3 = std::operator==(&varName,"ASSIGNED_AT_ROOT");
        if (!bVar3) {
          if (!bVar10) {
            std::operator<<(out,",");
          }
          pmVar8 = std::
                   map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&boolVarString_abi_cxx11_,(key_type *)&var);
          poVar6 = std::operator<<(out,(string *)pmVar8);
          std::operator<<(poVar6,":");
          cVar1 = sat.assigns.data[local_78];
          pcVar11 = "\'undef\'";
          if (cVar1 != '\0') {
            pcVar11 = "\'true\'";
            if (((uint)local_74 * -2 + 1 != (int)cVar1) &&
               (pcVar11 = "\'false\'", (uint)local_74 * 2 + -1 != (int)cVar1)) {
              abort();
            }
          }
          std::operator<<(out,pcVar11);
          bVar10 = false;
        }
      }
      std::__cxx11::string::~string((string *)&varName);
    }
    uVar12 = uVar12 + 1;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

void printDomains(std::ostream& out = std::cout) {
		out << "{";
		bool outerFirst = true;

		for (unsigned int i = 0; i < iv.size(); i++) {
			if (iv_introduced[i]) {
				continue;
			}

			IntVar* var = iv[i];
			const std::string varName = intVarString[var];

			if (varName.empty() || varName.find(so.filter_domains) == std::string::npos) {
				continue;
			}

			if (!outerFirst) {
				out << ",";
			}
			outerFirst = false;

			out << '"' << varName << '"' << ":";
			out << "[";
			if (var->vals != nullptr) {
				bool first = true;
				for (int val = var->getMin(); val <= var->getMax(); val++) {
					if (var->vals[val] != 0) {
						if (!first) {
							out << ",";
						}
						first = false;
						out << val;
					}
				}
			} else {
				out << '[' << var->getMin() << "," << var->getMax() << ']';
			}
			out << "]";
		}

		for (unsigned int i = 0; i < bv.size(); i++) {
			if (bv_introduced[i]) {
				continue;
			}

			const BoolView bview = bv[i];
			std::string bvstring = boolVarString[bview];

			if (bvstring.find(so.filter_domains) == std::string::npos) {
				continue;
			}

			// TODO: see if this is actually necessary
			if (bvstring.empty()) {
				// Try the other value
				BoolView otherval = bview;
				otherval.setSign(!otherval.getSign());
				bvstring = boolVarString[otherval];
			}

			if (bvstring == "ASSIGNED_AT_ROOT") {
				continue;
			}

			if (!outerFirst) {
				out << ",";
			}
			outerFirst = false;

			out << boolVarString[bview] << ":";
			/* out << litString[toInt(bview.getLit(true))] << ":"; */
			/* out << litString[toInt(bview.getLit(false))] << ":"; */
			if (!bview.isFixed()) {
				out << "'undef'";
			} else if (bview.isTrue()) {
				out << "'true'";
			} else if (bview.isFalse()) {
				out << "'false'";
			} else {
				abort();
			}
		}
		out << "}";
	}